

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

void recall_tree_ns::learn(recall_tree *b,single_learner *base,example *ec)

{
  undefined4 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  node *pnVar5;
  node_pred **ppnVar6;
  long in_RDX;
  long *in_RDI;
  float fVar7;
  node_pred *ls;
  uint32_t in_stack_0000003c;
  example *in_stack_00000040;
  uint32_t save_pred;
  label_t mc;
  bool cond;
  recall_tree *in_stack_00000050;
  uint32_t newcn;
  float which;
  uint32_t cn;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  example *in_stack_ffffffffffffff90;
  example *peVar8;
  example *in_stack_ffffffffffffff98;
  example *ec_00;
  uint in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  example *in_stack_ffffffffffffffa8;
  example *peVar9;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t local_30;
  float local_20;
  uint local_1c;
  
  predict((recall_tree *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (single_learner *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if (((*(byte *)(*in_RDI + 0x343a) & 1) != 0) && (*(int *)(in_RDX + 0x6828) != -1)) {
    local_1c = 0;
    uVar4 = local_1c;
    do {
      local_1c = uVar4;
      pnVar5 = v_array<recall_tree_ns::node>::operator[]
                         ((v_array<recall_tree_ns::node> *)(in_RDI + 2),(ulong)local_1c);
      if ((pnVar5->internal & 1U) == 0) goto LAB_0037e4f9;
      local_20 = train_node(in_stack_00000050,(single_learner *)mc,in_stack_00000040,
                            in_stack_0000003c);
      if ((*(byte *)((long)in_RDI + 0x4c) & 1) != 0) {
        in_stack_ffffffffffffffa4 = merand48((uint64_t *)in_stack_ffffffffffffff90);
        fVar7 = to_prob((float)((ulong)in_stack_ffffffffffffff90 >> 0x20));
        local_20 = (float)(~-(uint)(fVar7 < in_stack_ffffffffffffffa4) & 0x3f800000 |
                          -(uint)(fVar7 < in_stack_ffffffffffffffa4) & 0xbf800000);
      }
      pnVar5 = v_array<recall_tree_ns::node>::operator[]
                         ((v_array<recall_tree_ns::node> *)(in_RDI + 2),(ulong)local_1c);
      uVar4 = descend(pnVar5,local_20);
      bVar3 = stop_recurse_check((recall_tree *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                                 in_stack_ffffffffffffff88);
      insert_example_at_node
                ((recall_tree *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,
                 (example *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    } while (!bVar3);
    insert_example_at_node
              ((recall_tree *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,
               (example *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
LAB_0037e4f9:
    pnVar5 = v_array<recall_tree_ns::node>::operator[]
                       ((v_array<recall_tree_ns::node> *)(in_RDI + 2),(ulong)local_1c);
    if ((pnVar5->internal & 1U) == 0) {
      insert_example_at_node
                ((recall_tree *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,
                 (example *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    bVar3 = is_candidate((recall_tree *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
    if (bVar3) {
      uVar2 = *(undefined8 *)(in_RDX + 0x6828);
      uVar1 = *(undefined4 *)(in_RDX + 0x6850);
      add_node_id_feature((recall_tree *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                          (example *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      *(undefined8 *)(in_RDX + 0x6828) = 0x3f8000003f800000;
      *(undefined4 *)(in_RDX + 0x6830) = 0;
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
      *(undefined8 *)(in_RDX + 0x6828) = 0x3f800000bf800000;
      *(undefined4 *)(in_RDX + 0x6830) = 0;
      pnVar5 = v_array<recall_tree_ns::node>::operator[]
                         ((v_array<recall_tree_ns::node> *)(in_RDI + 2),(ulong)local_1c);
      ppnVar6 = v_array<recall_tree_ns::node_pred>::begin(&pnVar5->preds);
      ec_00 = (example *)*ppnVar6;
      while( true ) {
        peVar8 = ec_00;
        pnVar5 = v_array<recall_tree_ns::node>::operator[]
                           ((v_array<recall_tree_ns::node> *)(in_RDI + 2),(ulong)local_1c);
        ppnVar6 = v_array<recall_tree_ns::node_pred>::end(&pnVar5->preds);
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 & 0xffffff;
        peVar9 = peVar8;
        if (ec_00 != (example *)*ppnVar6) {
          pnVar5 = v_array<recall_tree_ns::node>::operator[]
                             ((v_array<recall_tree_ns::node> *)(in_RDI + 2),(ulong)local_1c);
          ppnVar6 = v_array<recall_tree_ns::node_pred>::begin(&pnVar5->preds);
          in_stack_ffffffffffffffa0 =
               CONCAT13(peVar8 < (example *)(*ppnVar6 + in_RDI[6]),(int3)in_stack_ffffffffffffffa0);
          in_stack_ffffffffffffff90 = peVar8;
        }
        if ((char)(in_stack_ffffffffffffffa0 >> 0x18) == '\0') break;
        local_30 = (uint32_t)uVar2;
        if (*(uint32_t *)&(peVar9->super_example_predict).indices._begin != local_30) {
          LEARNER::learner<char,_example>::learn
                    ((learner<char,_example> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),ec_00,
                     (size_t)in_stack_ffffffffffffff90);
        }
        ec_00 = (example *)&(peVar9->super_example_predict).indices.end_array;
      }
      remove_node_id_feature
                ((recall_tree *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (uint32_t)((ulong)ec_00 >> 0x20),in_stack_ffffffffffffff90);
      *(undefined8 *)(in_RDX + 0x6828) = uVar2;
      *(undefined4 *)(in_RDX + 0x6850) = uVar1;
    }
  }
  return;
}

Assistant:

void learn(recall_tree& b, single_learner& base, example& ec)
{
  predict(b, base, ec);

  if (b.all->training && ec.l.multi.label != (uint32_t)-1)  // if training the tree
  {
    uint32_t cn = 0;

    while (b.nodes[cn].internal)
    {
      float which = train_node(b, base, ec, cn);

      if (b.randomized_routing)
        which = (merand48(b.all->random_state) > to_prob(which) ? -1.f : 1.f);

      uint32_t newcn = descend(b.nodes[cn], which);
      bool cond = stop_recurse_check(b, cn, newcn);
      insert_example_at_node(b, cn, ec);

      if (cond)
      {
        insert_example_at_node(b, newcn, ec);
        break;
      }

      cn = newcn;
    }

    if (!b.nodes[cn].internal)
      insert_example_at_node(b, cn, ec);

    if (is_candidate(b, cn, ec))
    {
      MULTICLASS::label_t mc = ec.l.multi;
      uint32_t save_pred = ec.pred.multiclass;

      add_node_id_feature(b, cn, ec);

      ec.l.simple = {1.f, 1.f, 0.f};
      base.learn(ec, b.max_routers + mc.label - 1);
      ec.l.simple = {-1.f, 1.f, 0.f};

      for (node_pred* ls = b.nodes[cn].preds.begin();
           ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
      {
        if (ls->label != mc.label)
          base.learn(ec, b.max_routers + ls->label - 1);
      }

      remove_node_id_feature(b, cn, ec);

      ec.l.multi = mc;
      ec.pred.multiclass = save_pred;
    }
  }
}